

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O0

void __thiscall getarg_tests::doubledash::test_method(doubledash *this)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar1;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar2;
  pair<const_char_*,_ArgsManager::Flags> bar;
  pair<const_char_*,_ArgsManager::Flags> foo;
  ArgsManager local_args;
  char *in_stack_fffffffffffff9b8;
  ArgsManager *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  undefined1 fDefault;
  char (*in_stack_fffffffffffff9d0) [5];
  const_string *in_stack_fffffffffffff9e0;
  string *in_stack_fffffffffffff9e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffff9f0;
  ArgsManager *in_stack_fffffffffffff9f8;
  ArgsManager *in_stack_fffffffffffffa00;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  string *in_stack_fffffffffffffa40;
  ArgsManager *in_stack_fffffffffffffa48;
  undefined1 *local_568;
  undefined1 local_500 [8];
  undefined8 local_4f8;
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [70];
  allocator<char> local_49a;
  allocator<char> local_499;
  undefined1 local_498 [16];
  undefined1 local_488 [68];
  allocator<char> local_444;
  undefined1 local_443 [2];
  undefined1 local_441;
  undefined1 local_440 [16];
  undefined1 local_430 [70];
  allocator<char> local_3ea [26];
  _Base_ptr local_3d0;
  Flags local_3c8;
  undefined4 local_3bc;
  _Base_ptr local_3b8;
  Flags local_3b0;
  undefined4 local_3a4;
  _Base_ptr local_3a0;
  Flags local_398;
  _Base_ptr local_390;
  Flags local_388;
  undefined1 local_320 [128];
  undefined1 local_2a0 [80];
  undefined1 local_250 [584];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager((ArgsManager *)in_stack_fffffffffffff9b8);
  local_3a4 = 1;
  pVar2 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_fffffffffffff9d0,(Flags *)in_stack_fffffffffffff9c8);
  local_3b8 = (_Base_ptr)pVar2.first;
  local_3b0 = pVar2.second;
  local_3bc = 1;
  local_390 = local_3b8;
  local_388 = local_3b0;
  pVar2 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_fffffffffffff9d0,(Flags *)in_stack_fffffffffffff9c8);
  local_3d0 = (_Base_ptr)pVar2.first;
  local_3c8 = pVar2.second;
  local_3a0 = local_3d0;
  local_398 = local_3c8;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff9f0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff9e8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_fffffffffffff9f0,
             (pair<const_char_*,_ArgsManager::Flags> *)in_stack_fffffffffffff9e8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffff9b8);
  __l._M_len._0_7_ = in_stack_fffffffffffffa08;
  __l._M_array = (iterator)in_stack_fffffffffffffa00;
  __l._M_len._7_1_ = in_stack_fffffffffffffa0f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)in_stack_fffffffffffff9f8,__l,(allocator_type *)in_stack_fffffffffffff9f0);
  SetupArgs(in_stack_fffffffffffffa00,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff9f8);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)in_stack_fffffffffffff9c8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffff9b8);
  local_568 = local_250;
  do {
    local_568 = local_568 + -0x28;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_fffffffffffff9b8);
  } while (local_568 != local_2a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,(allocator<char> *)in_stack_fffffffffffff9f8);
  ResetArgs(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b8);
  std::allocator<char>::~allocator(local_3ea);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9f8,
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               in_stack_fffffffffffff9e0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    fDefault = (undefined1)((ulong)in_stack_fffffffffffff9c8 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               (char *)in_stack_fffffffffffffa00,(allocator<char> *)in_stack_fffffffffffff9f8);
    local_441 = ArgsManager::GetBoolArg
                          (in_stack_fffffffffffff9c0,(string *)in_stack_fffffffffffff9b8,
                           (bool)fDefault);
    local_443[0] = '\x01';
    in_stack_fffffffffffff9c8 = "true";
    in_stack_fffffffffffff9c0 = (ArgsManager *)local_443;
    in_stack_fffffffffffff9b8 = "local_args.GetBoolArg(\"-foo\", false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_430,local_440,0x188,1,2,&local_441);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    std::allocator<char>::~allocator((allocator<char> *)(local_443 + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
             (char *)in_stack_fffffffffffffa00,(allocator<char> *)in_stack_fffffffffffff9f8);
  ResetArgs(in_stack_fffffffffffffa48,in_stack_fffffffffffffa40);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9b8);
  std::allocator<char>::~allocator(&local_444);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9f8,
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               in_stack_fffffffffffff9e0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               (char *)in_stack_fffffffffffffa00,(allocator<char> *)in_stack_fffffffffffff9f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               (char *)in_stack_fffffffffffffa00,(allocator<char> *)in_stack_fffffffffffff9f8);
    ArgsManager::GetArg(in_stack_fffffffffffff9f8,&in_stack_fffffffffffff9f0->first,
                        in_stack_fffffffffffff9e8);
    in_stack_fffffffffffff9c8 = "\"verbose\"";
    in_stack_fffffffffffff9c0 = (ArgsManager *)0x1d1f261;
    in_stack_fffffffffffff9b8 = "local_args.GetArg(\"-foo\", \"\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_488,local_498,0x18b,1,2,local_320);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    std::allocator<char>::~allocator(&local_49a);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    std::allocator<char>::~allocator(&local_499);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff9f8,
               (const_string *)in_stack_fffffffffffff9f0,(size_t)in_stack_fffffffffffff9e8,
               in_stack_fffffffffffff9e0);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff9c0,(char (*) [1])in_stack_fffffffffffff9b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff9c8,
               (pointer)in_stack_fffffffffffff9c0,(unsigned_long)in_stack_fffffffffffff9b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08),
               (char *)in_stack_fffffffffffffa00,(allocator<char> *)in_stack_fffffffffffff9f8);
    local_4f8 = ArgsManager::GetIntArg
                          (in_stack_fffffffffffff9c0,(string *)in_stack_fffffffffffff9b8,
                           (int64_t)in_stack_fffffffffffff9c8);
    local_500._0_4_ = 1;
    in_stack_fffffffffffff9c8 = "1";
    in_stack_fffffffffffff9c0 = (ArgsManager *)local_500;
    in_stack_fffffffffffff9b8 = "local_args.GetIntArg(\"-bar\", 0)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              (local_4e0,local_4f0,0x18c,1,2,&local_4f8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff9b8);
    std::allocator<char>::~allocator((allocator<char> *)(local_500 + 7));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff9b8);
    in_stack_fffffffffffffa0f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffa0f);
  ArgsManager::~ArgsManager((ArgsManager *)in_stack_fffffffffffff9b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(doubledash)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    const auto bar = std::make_pair("-bar", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo, bar});
    ResetArgs(local_args, "--foo");
    BOOST_CHECK_EQUAL(local_args.GetBoolArg("-foo", false), true);

    ResetArgs(local_args, "--foo=verbose --bar=1");
    BOOST_CHECK_EQUAL(local_args.GetArg("-foo", ""), "verbose");
    BOOST_CHECK_EQUAL(local_args.GetIntArg("-bar", 0), 1);
}